

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O1

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  
  iVar4 = run_container_cardinality(container1);
  iVar5 = container2->cardinality;
  if (iVar5 == -1) {
    iVar5 = bitset_container_compute_cardinality(container2);
  }
  if (iVar5 == iVar4) {
    uVar8 = (ulong)container1->n_runs;
    bVar14 = (long)uVar8 < 1;
    if (0 < (long)uVar8) {
      uVar9 = 0;
      do {
        uVar1 = container1->runs[uVar9].value;
        uVar2 = container1->runs[uVar9].length;
        if (uVar2 == 0) {
          if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            return bVar14;
          }
        }
        else {
          uVar7 = (uint)uVar2 + (uint)uVar1 + 1;
          uVar10 = (ulong)(uVar1 >> 6);
          uVar13 = -1L << ((byte)uVar1 & 0x3f);
          uVar6 = uVar7 >> 6;
          uVar11 = -1L << ((byte)uVar7 & 0x3f);
          if (uVar1 >> 6 == uVar6) {
            bVar15 = (uVar13 & ~(uVar11 | container2->words[uVar6])) == 0;
          }
          else {
            puVar3 = container2->words;
            if (puVar3[uVar10] < uVar13) {
              return bVar14;
            }
            if ((uint)uVar2 + (uint)uVar1 < 0xffff) {
              uVar12 = uVar11 | puVar3[uVar6];
              goto joined_r0x0011cf07;
            }
            while( true ) {
              bVar15 = (ulong)uVar6 <= uVar10 + 1 || 0x3fe < uVar10;
              if (bVar15) break;
              uVar12 = puVar3[uVar10 + 1];
              uVar10 = uVar10 + 1;
joined_r0x0011cf07:
              if (uVar12 != 0xffffffffffffffff) {
                return bVar14;
              }
            }
          }
          if (!bVar15) {
            return bVar14;
          }
        }
        uVar9 = uVar9 + 1;
        bVar14 = uVar8 <= uVar9;
      } while (uVar9 != uVar8);
    }
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {
    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)
                          ? container2->cardinality
                          : bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}